

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void getSubVectors(HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,
                  double *data1,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
                  double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
                  HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
                  double *sub_matrix_value)

{
  int iVar1;
  int iVar2;
  HighsInt *current_set_entry_00;
  value_type vVar3;
  const_reference pvVar4;
  MatrixFormat *pMVar5;
  const_reference pvVar6;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  HighsIndexCollection *in_RDI;
  long in_R8;
  HighsIndexCollection *in_R9;
  int *in_stack_00000008;
  HighsInt iEl;
  HighsInt iVector;
  HighsInt k;
  HighsInt current_set_entry;
  HighsInt in_to_vector;
  HighsInt in_from_vector;
  HighsInt out_to_vector;
  HighsInt out_from_vector;
  HighsInt to_k;
  HighsInt from_k;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 uVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar9;
  
  limits(in_RDI,(HighsInt *)&stack0xffffffffffffffcc,(HighsInt *)&stack0xffffffffffffffc8);
  iVar8 = -1;
  uVar7 = 0;
  *in_stack_00000008 = 0;
  *_out_to_vector = 0;
  iVar9 = in_stack_ffffffffffffffcc;
  while( true ) {
    if (in_stack_ffffffffffffffc8 < in_stack_ffffffffffffffcc) {
      return;
    }
    current_set_entry_00 = (HighsInt *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
    ;
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffc4;
    updateOutInIndex(in_R9,(HighsInt *)CONCAT44(iVar9,in_stack_ffffffffffffffc8),
                     (HighsInt *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (HighsInt *)CONCAT44(in_stack_ffffffffffffffbc,iVar8),
                     (HighsInt *)CONCAT44(uVar7,in_stack_ffffffffffffffcc),current_set_entry_00);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffac;
    for (; in_stack_ffffffffffffffac <= in_stack_ffffffffffffffc0;
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
      if (_iEl != 0) {
        *(undefined8 *)(_iEl + (long)*in_stack_00000008 * 8) =
             *(undefined8 *)(in_RDX + (long)in_stack_ffffffffffffffac * 8);
      }
      if (_k != 0) {
        *(undefined8 *)(_k + (long)*in_stack_00000008 * 8) =
             *(undefined8 *)(in_RCX + (long)in_stack_ffffffffffffffac * 8);
      }
      if (_in_to_vector != 0) {
        *(undefined8 *)(_in_to_vector + (long)*in_stack_00000008 * 8) =
             *(undefined8 *)(in_R8 + (long)in_stack_ffffffffffffffac * 8);
      }
      if (_to_k != 0) {
        iVar1 = *_out_to_vector;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_R9->is_set_,
                            (long)in_stack_ffffffffffffffac);
        iVar2 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_R9->is_set_,
                            (long)in_stack_ffffffffffffffc4);
        *(int *)(_to_k + (long)*in_stack_00000008 * 4) = (iVar1 + iVar2) - *pvVar4;
      }
      *in_stack_00000008 = *in_stack_00000008 + 1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_R9->is_set_,
                        (long)in_stack_ffffffffffffffc4);
    vVar3 = *pvVar4;
    while (in_stack_ffffffffffffffa8 = vVar3,
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&in_R9->is_set_,
                              (long)(in_stack_ffffffffffffffc0 + 1)), vVar3 < *pvVar4) {
      if (matrix != (HighsSparseMatrix *)0x0) {
        pMVar5 = (MatrixFormat *)
                 std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(in_R9->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)in_stack_ffffffffffffffa8);
        (&matrix->format_)[*_out_to_vector] = *pMVar5;
      }
      if (data2 != (double *)0x0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&in_R9[1].from_,
                            (long)in_stack_ffffffffffffffa8);
        data2[*_out_to_vector] = *pvVar6;
      }
      *_out_to_vector = *_out_to_vector + 1;
      vVar3 = in_stack_ffffffffffffffa8 + 1;
    }
    if (in_stack_ffffffffffffffc0 == in_ESI + -1) break;
    if (iVar8 == in_ESI + -1) {
      return;
    }
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1;
  }
  return;
}

Assistant:

void getSubVectors(const HighsIndexCollection& index_collection,
                   const HighsInt data_dim, const double* data0,
                   const double* data1, const double* data2,
                   const HighsSparseMatrix& matrix, HighsInt& num_sub_vector,
                   double* sub_vector_data0, double* sub_vector_data1,
                   double* sub_vector_data2, HighsInt& sub_matrix_num_nz,
                   HighsInt* sub_matrix_start, HighsInt* sub_matrix_index,
                   double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, out_from_vector, out_to_vector,
                     in_from_vector, in_to_vector, current_set_entry);
    assert(out_to_vector < data_dim);
    assert(in_to_vector < data_dim);
    for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
         iVector++) {
      if (sub_vector_data0 != nullptr)
        sub_vector_data0[num_sub_vector] = data0[iVector];
      if (sub_vector_data1 != nullptr)
        sub_vector_data1[num_sub_vector] = data1[iVector];
      if (sub_vector_data2 != nullptr)
        sub_vector_data2[num_sub_vector] = data2[iVector];
      if (sub_matrix_start != nullptr)
        sub_matrix_start[num_sub_vector] = sub_matrix_num_nz +
                                           matrix.start_[iVector] -
                                           matrix.start_[out_from_vector];
      num_sub_vector++;
    }
    for (HighsInt iEl = matrix.start_[out_from_vector];
         iEl < matrix.start_[out_to_vector + 1]; iEl++) {
      if (sub_matrix_index != nullptr)
        sub_matrix_index[sub_matrix_num_nz] = matrix.index_[iEl];
      if (sub_matrix_value != nullptr)
        sub_matrix_value[sub_matrix_num_nz] = matrix.value_[iEl];
      sub_matrix_num_nz++;
    }
    if (out_to_vector == data_dim - 1 || in_to_vector == data_dim - 1) break;
  }
}